

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall
CTcPrsOpAnd::eval_constant(CTcPrsOpAnd *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CTcPrsNode *pCVar4;
  
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if ((((CTcConstVal *)CONCAT44(extraout_var_00,iVar1))->typ_ == TC_CVT_NIL) ||
     (iVar1 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_00,iVar1)), iVar1 != 0))
  {
    right = left;
  }
  iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  if (CONCAT44(extraout_var_01,iVar1) != 0) {
    iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
    iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
    if ((((CTcConstVal *)CONCAT44(extraout_var_03,iVar2))->typ_ == TC_CVT_NIL) ||
       (iVar2 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_03,iVar2)), iVar2 != 0
       )) {
      uVar3 = 1;
    }
    else {
      uVar3 = 2;
    }
    *(undefined4 *)CONCAT44(extraout_var_02,iVar1) = uVar3;
    return right;
  }
  pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)right;
  (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00358188;
  return pCVar4;
}

Assistant:

CTcPrsNode *CTcPrsOpAnd::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    /* 
     *   Check for constants.  If the first expression is constant, the
     *   result will always be either 'nil' (if the first expression's
     *   constant value is nil), or the value of the second expression (if
     *   the first expression's constant value is 'true').
     *   
     *   Note that it doesn't matter whether or not the right side is a
     *   constant.  If the left is nil, the right will never be executed
     *   because of the short-circuit logic; if the left is true, the
     *   result will always be the result of the right value.  
     */
    if (left->is_const())
    {
        CTcPrsNode *ret;
        
        /*
         *   The left value is a constant, so we can eliminate the &&.  If
         *   the left value is nil, the result is nil; otherwise, it's the
         *   right half.  
         */
        if (left->get_const_val()->get_val_bool())
        {
            /* the left side is true - the result is the right side */
            ret = right;
        }
        else
        {
            /* 
             *   The left side is nil - the result is nil, and the right
             *   side never gets executed.
             */
            ret = left;
        }

        /* ensure the result is a boolean value */
        if (ret->is_const())
        {
            /* make it a true/nil constant value */
            ret->get_const_val()
                ->set_bool(ret->get_const_val()->get_val_bool());
        }
        else
        {
            /* boolean-ize the value at run-time as needed */
            ret = new CTPNBoolize(ret);
        }

        /* return the result */
        return ret;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}